

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

void non_empty_readdir_cb(uv_fs_t *req)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  size_t sVar7;
  uv_getaddrinfo_t *puVar8;
  undefined4 *puVar9;
  uv_dirent_type_t uVar10;
  int *piVar11;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long extraout_RDX_02;
  char *unaff_RBX;
  char *pcVar12;
  size_t *psVar13;
  undefined8 *puVar14;
  int *piVar15;
  long lVar16;
  char *unaff_R14;
  char *__s1;
  undefined1 auStack_6c0 [144];
  undefined8 uStack_630;
  char **ppcStack_620;
  char **ppcStack_618;
  char **ppcStack_610;
  undefined1 auStack_608 [144];
  undefined8 uStack_578;
  char **ppcStack_568;
  code *pcStack_560;
  undefined1 auStack_558 [160];
  char **ppcStack_4b8;
  char *pcStack_4a8;
  long lStack_4a0;
  long lStack_498;
  char *pcStack_490;
  char **ppcStack_488;
  char **ppcStack_480;
  undefined1 *puStack_470;
  char *pcStack_468;
  double dStack_460;
  double dStack_458;
  double dStack_450;
  char *pcStack_440;
  char *pcStack_430;
  char cStack_428;
  char cStack_427;
  char *pcStack_28;
  code *pcStack_20;
  
  __s1 = dirents[0].name;
  pcVar4 = (char *)readdir_req.ptr;
  if (req == &readdir_req) {
    if (readdir_req.fs_type != UV_FS_READDIR) goto LAB_0015b25f;
    if (readdir_req.result != 1) {
      if (readdir_req.result != 0) goto LAB_0015b264;
      req = &readdir_req;
      pcStack_20 = (code *)0x15b16f;
      uv_fs_req_cleanup();
      if (non_empty_readdir_cb_count == 3) {
        pcStack_20 = (code *)0x15b181;
        uVar3 = uv_default_loop();
        uv_fs_closedir(uVar3,&closedir_req,pcVar4,non_empty_closedir_cb);
        return;
      }
      goto LAB_0015b269;
    }
    if (*readdir_req.ptr != dirents) goto LAB_0015b26e;
    pcStack_20 = (code *)0x15b1c5;
    iVar1 = strcmp(dirents[0].name,"file1");
    if (iVar1 != 0) {
      pcStack_20 = (code *)0x15b1d8;
      iVar1 = strcmp(__s1,"file2");
      if (iVar1 == 0) goto LAB_0015b1f3;
      pcStack_20 = (code *)0x15b1eb;
      req = (uv_fs_t *)__s1;
      iVar1 = strcmp(__s1,"test_subdir");
      if (iVar1 == 0) goto LAB_0015b1f3;
      goto LAB_0015b273;
    }
LAB_0015b1f3:
    pcStack_20 = (code *)0x15b202;
    req = (uv_fs_t *)__s1;
    iVar1 = strcmp(__s1,"test_subdir");
    uVar10 = dirents[0].type;
    if (iVar1 != 0) {
      if (dirents[0].type == UV_DIRENT_FILE) goto LAB_0015b21b;
      pcStack_20 = (code *)0x15b216;
      non_empty_readdir_cb_cold_5();
    }
    if (uVar10 == UV_DIRENT_DIR) {
LAB_0015b21b:
      non_empty_readdir_cb_count = non_empty_readdir_cb_count + 1;
      pcStack_20 = (code *)0x15b230;
      uv_fs_req_cleanup(&readdir_req);
      *(uv_dirent_t **)pcVar4 = dirents;
      *(undefined8 *)((long)pcVar4 + 8) = 1;
      pcStack_20 = (code *)0x15b240;
      uVar3 = uv_default_loop();
      uv_fs_readdir(uVar3,&readdir_req,pcVar4,non_empty_readdir_cb);
      return;
    }
  }
  else {
    pcStack_20 = (code *)0x15b25f;
    non_empty_readdir_cb_cold_1();
LAB_0015b25f:
    pcStack_20 = (code *)0x15b264;
    non_empty_readdir_cb_cold_2();
    pcVar4 = unaff_RBX;
LAB_0015b264:
    pcStack_20 = (code *)0x15b269;
    non_empty_readdir_cb_cold_8();
LAB_0015b269:
    pcStack_20 = (code *)0x15b26e;
    non_empty_readdir_cb_cold_7();
LAB_0015b26e:
    pcStack_20 = (code *)0x15b273;
    non_empty_readdir_cb_cold_3();
    __s1 = unaff_R14;
LAB_0015b273:
    pcStack_20 = (code *)0x15b278;
    non_empty_readdir_cb_cold_4();
  }
  pcStack_20 = non_empty_closedir_cb;
  non_empty_readdir_cb_cold_6();
  if (req == &closedir_req) {
    if (closedir_req.result == 0) {
      pcStack_28 = (char *)0x15b2a0;
      uv_fs_req_cleanup(&closedir_req);
      non_empty_closedir_cb_count = non_empty_closedir_cb_count + 1;
      return;
    }
  }
  else {
    pcStack_28 = (char *)0x15b2ad;
    non_empty_closedir_cb_cold_1();
  }
  pcStack_28 = (char *)0x15b2b2;
  non_empty_closedir_cb_cold_2();
  pcStack_430 = (char *)0x400;
  pcStack_440 = (char *)0x15b2d2;
  pcStack_28 = pcVar4;
  iVar1 = uv_exepath(&cStack_428);
  if (iVar1 == 0) {
    pcVar12 = executable_path;
    if ((executable_path[0] == '.') && (executable_path[1] == '/')) {
      pcVar12 = executable_path + 2;
    }
    pcStack_440 = (char *)0x15b307;
    pcVar4 = strstr(&cStack_428,pcVar12);
    if (pcVar4 == (char *)0x0) {
LAB_0015b419:
      pcStack_440 = (char *)0x15b41e;
      run_test_get_currentexe_cold_13();
      pcVar4 = pcVar12;
      goto LAB_0015b41e;
    }
    pcStack_440 = (char *)0x15b31b;
    iVar1 = strcmp(pcVar4,pcVar12);
    pcVar4 = pcStack_430;
    if (iVar1 != 0) goto LAB_0015b419;
    pcStack_440 = (char *)0x15b332;
    pcVar12 = (char *)strlen(&cStack_428);
    if (pcVar4 != pcVar12) goto LAB_0015b423;
    pcStack_430 = (char *)0x400;
    pcStack_440 = (char *)0x15b34e;
    iVar1 = uv_exepath(0);
    if (iVar1 != -0x16) goto LAB_0015b428;
    pcStack_440 = (char *)0x15b363;
    iVar1 = uv_exepath(&cStack_428,0);
    if (iVar1 != -0x16) goto LAB_0015b42d;
    pcStack_430 = (char *)0x0;
    pcStack_440 = (char *)0x15b382;
    iVar1 = uv_exepath(&cStack_428);
    if (iVar1 != -0x16) goto LAB_0015b432;
    pcVar4 = &cStack_428;
    pcStack_440 = (char *)0x15b3a2;
    memset(pcVar4,0xff,0x400);
    pcStack_430 = (char *)0x1;
    pcStack_440 = (char *)0x15b3b6;
    iVar1 = uv_exepath(pcVar4);
    if (iVar1 != 0) goto LAB_0015b437;
    if (pcStack_430 != (char *)0x0) goto LAB_0015b43c;
    if (cStack_428 != '\0') goto LAB_0015b441;
    pcVar4 = &cStack_428;
    pcStack_440 = (char *)0x15b3e0;
    memset(pcVar4,0xff,0x400);
    pcStack_430 = (char *)0x2;
    pcStack_440 = (char *)0x15b3f4;
    iVar1 = uv_exepath(pcVar4);
    if (iVar1 != 0) goto LAB_0015b446;
    if (pcStack_430 != (char *)0x1) goto LAB_0015b44b;
    if (cStack_428 == '\0') goto LAB_0015b450;
    if (cStack_427 == '\0') {
      return;
    }
  }
  else {
LAB_0015b41e:
    pcStack_440 = (char *)0x15b423;
    run_test_get_currentexe_cold_1();
LAB_0015b423:
    pcStack_440 = (char *)0x15b428;
    run_test_get_currentexe_cold_2();
LAB_0015b428:
    pcStack_440 = (char *)0x15b42d;
    run_test_get_currentexe_cold_3();
LAB_0015b42d:
    pcStack_440 = (char *)0x15b432;
    run_test_get_currentexe_cold_4();
LAB_0015b432:
    pcStack_440 = (char *)0x15b437;
    run_test_get_currentexe_cold_5();
LAB_0015b437:
    pcStack_440 = (char *)0x15b43c;
    run_test_get_currentexe_cold_6();
LAB_0015b43c:
    pcStack_440 = (char *)0x15b441;
    run_test_get_currentexe_cold_7();
LAB_0015b441:
    pcStack_440 = (char *)0x15b446;
    run_test_get_currentexe_cold_8();
LAB_0015b446:
    pcStack_440 = (char *)0x15b44b;
    run_test_get_currentexe_cold_9();
LAB_0015b44b:
    pcStack_440 = (char *)0x15b450;
    run_test_get_currentexe_cold_10();
LAB_0015b450:
    pcStack_440 = (char *)0x15b455;
    run_test_get_currentexe_cold_12();
  }
  pcStack_440 = (char *)0x15b45a;
  run_test_get_currentexe_cold_11();
  dStack_460 = -1.0;
  dStack_458 = -1.0;
  dStack_450 = -1.0;
  pcStack_468 = (char *)0x15b486;
  pcStack_440 = pcVar4;
  uv_loadavg(&dStack_460);
  if (dStack_460 < 0.0) {
    pcStack_468 = (char *)0x15b4bd;
    run_test_get_loadavg_cold_3();
LAB_0015b4bd:
    pcStack_468 = (char *)0x15b4c2;
    run_test_get_loadavg_cold_2();
  }
  else {
    if (dStack_458 < 0.0) goto LAB_0015b4bd;
    if (0.0 <= dStack_450) {
      return;
    }
  }
  pcStack_468 = (char *)0x15b4c7;
  run_test_get_loadavg_cold_1();
  ppcStack_480 = (char **)0x15b4d1;
  puStack_470 = (undefined1 *)&dStack_460;
  pcStack_468 = __s1;
  ppcVar5 = (char **)uv_get_free_memory();
  ppcStack_480 = (char **)0x15b4d9;
  ppcVar6 = (char **)uv_get_total_memory();
  ppcStack_480 = (char **)0x15b4e1;
  uVar3 = uv_get_constrained_memory();
  ppcStack_480 = (char **)0x15b4f8;
  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu\n",ppcVar5,ppcVar6,uVar3);
  if (ppcVar5 == (char **)0x0) {
    ppcStack_480 = (char **)0x15b516;
    run_test_get_memory_cold_3();
LAB_0015b516:
    ppcStack_480 = (char **)0x15b51b;
    run_test_get_memory_cold_2();
  }
  else {
    if (ppcVar6 == (char **)0x0) goto LAB_0015b516;
    if (ppcVar5 < ppcVar6) {
      return;
    }
  }
  ppcStack_480 = (char **)run_test_get_passwd;
  run_test_get_memory_cold_1();
  ppcStack_4b8 = (char **)0x15b52f;
  ppcStack_480 = ppcVar5;
  iVar1 = uv_os_get_passwd(&pcStack_4a8);
  ppcVar6 = ppcStack_488;
  if (iVar1 == 0) {
    if (*pcStack_4a8 == '\0') goto LAB_0015b5f3;
    if (*pcStack_490 == '\0') goto LAB_0015b5f8;
    ppcStack_4b8 = (char **)0x15b560;
    sVar7 = strlen((char *)ppcStack_488);
    ppcVar5 = ppcVar6;
    if (sVar7 != 1) {
      if (sVar7 != 0) {
        if (*(char *)((long)ppcVar6 + (sVar7 - 1)) == '/') {
          ppcStack_4b8 = (char **)0x15b57b;
          run_test_get_passwd_cold_13();
          goto LAB_0015b57b;
        }
        goto LAB_0015b584;
      }
      goto LAB_0015b62a;
    }
LAB_0015b57b:
    if (*(char *)ppcVar6 == '/') {
LAB_0015b584:
      if (lStack_4a0 < 0) goto LAB_0015b5fd;
      if (lStack_498 < 0) goto LAB_0015b602;
      ppcVar5 = &pcStack_4a8;
      ppcStack_4b8 = (char **)0x15b5a1;
      uv_os_free_passwd(ppcVar5);
      if (pcStack_4a8 != (char *)0x0) goto LAB_0015b607;
      if (pcStack_490 != (char *)0x0) goto LAB_0015b60c;
      if (ppcStack_488 != (char **)0x0) goto LAB_0015b611;
      ppcVar5 = &pcStack_4a8;
      ppcStack_4b8 = (char **)0x15b5c4;
      uv_os_free_passwd(ppcVar5);
      if (pcStack_4a8 != (char *)0x0) goto LAB_0015b616;
      if (pcStack_490 != (char *)0x0) goto LAB_0015b61b;
      if (ppcStack_488 != (char **)0x0) goto LAB_0015b620;
      ppcStack_4b8 = (char **)0x15b5e1;
      iVar1 = uv_os_get_passwd(0);
      if (iVar1 == -0x16) {
        return;
      }
      goto LAB_0015b625;
    }
  }
  else {
    ppcStack_4b8 = (char **)0x15b5f3;
    run_test_get_passwd_cold_1();
LAB_0015b5f3:
    ppcStack_4b8 = (char **)0x15b5f8;
    run_test_get_passwd_cold_15();
LAB_0015b5f8:
    ppcStack_4b8 = (char **)0x15b5fd;
    run_test_get_passwd_cold_14();
LAB_0015b5fd:
    ppcStack_4b8 = (char **)0x15b602;
    run_test_get_passwd_cold_4();
LAB_0015b602:
    ppcStack_4b8 = (char **)0x15b607;
    run_test_get_passwd_cold_5();
LAB_0015b607:
    ppcStack_4b8 = (char **)0x15b60c;
    run_test_get_passwd_cold_6();
LAB_0015b60c:
    ppcStack_4b8 = (char **)0x15b611;
    run_test_get_passwd_cold_7();
LAB_0015b611:
    ppcStack_4b8 = (char **)0x15b616;
    run_test_get_passwd_cold_8();
LAB_0015b616:
    ppcStack_4b8 = (char **)0x15b61b;
    run_test_get_passwd_cold_9();
LAB_0015b61b:
    ppcStack_4b8 = (char **)0x15b620;
    run_test_get_passwd_cold_10();
LAB_0015b620:
    ppcStack_4b8 = (char **)0x15b625;
    run_test_get_passwd_cold_11();
LAB_0015b625:
    ppcStack_4b8 = (char **)0x15b62a;
    run_test_get_passwd_cold_12();
LAB_0015b62a:
    ppcStack_4b8 = (char **)0x15b62f;
    run_test_get_passwd_cold_3();
  }
  ppcStack_4b8 = (char **)run_test_getaddrinfo_fail;
  run_test_get_passwd_cold_2();
  iVar1 = (int)auStack_558;
  pcStack_560 = (code *)0x15b641;
  ppcStack_4b8 = ppcVar5;
  uVar3 = uv_default_loop();
  pcStack_560 = (code *)0x15b65b;
  iVar2 = uv_getaddrinfo(uVar3,auStack_558,abort,0,0,0);
  if (iVar2 == -0x16) {
    pcStack_560 = (code *)0x15b669;
    uVar3 = uv_default_loop();
    pcStack_560 = (code *)0x15b688;
    iVar1 = (int)auStack_558;
    iVar2 = uv_getaddrinfo(uVar3,auStack_558,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",0,0);
    if (iVar2 != 0) goto LAB_0015b6ec;
    pcStack_560 = (code *)0x15b691;
    uVar3 = uv_default_loop();
    iVar1 = 0;
    pcStack_560 = (code *)0x15b69b;
    iVar2 = uv_run(uVar3);
    if (iVar2 != 0) goto LAB_0015b6f1;
    if (fail_cb_called != 1) goto LAB_0015b6f6;
    pcStack_560 = (code *)0x15b6ad;
    ppcVar5 = (char **)uv_default_loop();
    pcStack_560 = (code *)0x15b6c1;
    uv_walk(ppcVar5,close_walk_cb,0);
    iVar1 = 0;
    pcStack_560 = (code *)0x15b6cb;
    uv_run(ppcVar5);
    pcStack_560 = (code *)0x15b6d0;
    uVar3 = uv_default_loop();
    pcStack_560 = (code *)0x15b6d8;
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_560 = (code *)0x15b6ec;
    run_test_getaddrinfo_fail_cold_1();
LAB_0015b6ec:
    pcStack_560 = (code *)0x15b6f1;
    run_test_getaddrinfo_fail_cold_2();
LAB_0015b6f1:
    pcStack_560 = (code *)0x15b6f6;
    run_test_getaddrinfo_fail_cold_3();
LAB_0015b6f6:
    pcStack_560 = (code *)0x15b6fb;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_560 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  if (fail_cb_called == 0) {
    if (-1 < iVar1) goto LAB_0015b727;
    if (extraout_RDX == 0) {
      ppcStack_568 = (char **)0x15b71a;
      uv_freeaddrinfo(0);
      fail_cb_called = fail_cb_called + 1;
      return;
    }
  }
  else {
    ppcStack_568 = (char **)0x15b727;
    getaddrinfo_fail_cb_cold_1();
LAB_0015b727:
    ppcStack_568 = (char **)0x15b72c;
    getaddrinfo_fail_cb_cold_2();
  }
  ppcStack_568 = (char **)run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  ppcStack_610 = (char **)0x15b73e;
  ppcStack_568 = ppcVar5;
  uVar3 = uv_default_loop();
  ppcStack_610 = (char **)0x15b758;
  iVar1 = uv_getaddrinfo(uVar3,auStack_608,0,"xyzzy.xyzzy.xyzzy.",0,0);
  if (iVar1 < 0) {
    ppcStack_610 = (char **)0x15b769;
    uv_freeaddrinfo(uStack_578);
    ppcStack_610 = (char **)0x15b76e;
    ppcVar5 = (char **)uv_default_loop();
    ppcStack_610 = (char **)0x15b782;
    uv_walk(ppcVar5,close_walk_cb,0);
    ppcStack_610 = (char **)0x15b78c;
    uv_run(ppcVar5,0);
    ppcStack_610 = (char **)0x15b791;
    uVar3 = uv_default_loop();
    ppcStack_610 = (char **)0x15b799;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    ppcStack_610 = (char **)0x15b7ad;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  ppcStack_610 = (char **)run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  ppcStack_618 = (char **)0x15b7bd;
  ppcStack_610 = ppcVar5;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  ppcStack_618 = (char **)0x15b7c9;
  puVar8 = (uv_getaddrinfo_t *)uv_default_loop();
  ppcStack_618 = (char **)0x15b7ec;
  iVar1 = uv_getaddrinfo(puVar8,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
  if (iVar1 == 0) {
    ppcStack_618 = (char **)0x15b7f5;
    puVar8 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_618 = (char **)0x15b7ff;
    uv_run(puVar8,0);
    if (getaddrinfo_cbs != 1) goto LAB_0015b845;
    ppcStack_618 = (char **)0x15b80d;
    ppcVar5 = (char **)uv_default_loop();
    ppcStack_618 = (char **)0x15b821;
    uv_walk(ppcVar5,close_walk_cb,0);
    ppcStack_618 = (char **)0x15b82b;
    uv_run(ppcVar5,0);
    ppcStack_618 = (char **)0x15b830;
    puVar8 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_618 = (char **)0x15b838;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    ppcStack_618 = (char **)0x15b845;
    run_test_getaddrinfo_basic_cold_1();
LAB_0015b845:
    ppcStack_618 = (char **)0x15b84a;
    run_test_getaddrinfo_basic_cold_2();
  }
  ppcStack_618 = (char **)getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  ppcStack_618 = ppcVar5;
  if (getaddrinfo_handle == puVar8) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    ppcStack_620 = (char **)0x15b867;
    free(puVar8);
    uv_freeaddrinfo(extraout_RDX_00);
    return;
  }
  ppcStack_620 = (char **)run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  ppcStack_620 = ppcVar5;
  uVar3 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar3,auStack_6c0,0,"localhost",0,0);
  if (iVar1 == 0) {
    uv_freeaddrinfo(uStack_630);
    ppcVar5 = (char **)uv_default_loop();
    uv_walk(ppcVar5,close_walk_cb,0);
    uv_run(ppcVar5,0);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  puVar8 = getaddrinfo_handles;
  piVar15 = callback_counts;
  lVar16 = 0;
  do {
    *piVar15 = 0;
    puVar14 = (undefined8 *)0x4;
    puVar9 = (undefined4 *)malloc(4);
    if (puVar9 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015b9e4:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_0015b9e9;
    }
    *puVar9 = (int)lVar16;
    puVar8->data = puVar9;
    puVar14 = (undefined8 *)uv_default_loop();
    iVar1 = uv_getaddrinfo(puVar14,puVar8,getaddrinfo_cuncurrent_cb,"localhost",0,0,ppcVar5);
    if (iVar1 != 0) goto LAB_0015b9e4;
    lVar16 = lVar16 + 1;
    puVar8 = puVar8 + 1;
    piVar15 = piVar15 + 1;
  } while (lVar16 != 10);
  puVar14 = (undefined8 *)uv_default_loop();
  lVar16 = 0;
  uv_run(puVar14,0);
  do {
    if (*(int *)((long)callback_counts + lVar16) != 1) goto LAB_0015b9e9;
    lVar16 = lVar16 + 4;
  } while (lVar16 != 0x28);
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  puVar14 = (undefined8 *)uv_default_loop();
  iVar1 = uv_loop_close();
  if (iVar1 == 0) {
    return;
  }
LAB_0015b9ee:
  run_test_getaddrinfo_concurrent_cold_3();
  piVar15 = (int *)*puVar14;
  piVar11 = callback_counts;
  psVar13 = &closedir_req.bufsml[1].len;
  lVar16 = 0;
  do {
    psVar13 = psVar13 + 0x14;
    if (psVar13 == puVar14) goto LAB_0015ba2b;
    piVar11 = piVar11 + 1;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar16 = extraout_RDX_02;
LAB_0015ba2b:
  if (*piVar15 == (int)lVar16) {
    *piVar11 = *piVar11 + 1;
    free(piVar15);
    uv_freeaddrinfo(extraout_RDX_01);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(piVar15,0);
  return;
LAB_0015b9e9:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015b9ee;
}

Assistant:

static void non_empty_readdir_cb(uv_fs_t* req) {
  uv_dir_t* dir;

  ASSERT(req == &readdir_req);
  ASSERT(req->fs_type == UV_FS_READDIR);
  dir = req->ptr;

  if (req->result == 0) {
    uv_fs_req_cleanup(req);
    ASSERT(non_empty_readdir_cb_count == 3);
    uv_fs_closedir(uv_default_loop(),
                   &closedir_req,
                   dir,
                   non_empty_closedir_cb);
  } else {
    ASSERT(req->result == 1);
    ASSERT(dir->dirents == dirents);
    ASSERT(strcmp(dirents[0].name, "file1") == 0 ||
           strcmp(dirents[0].name, "file2") == 0 ||
           strcmp(dirents[0].name, "test_subdir") == 0);
#ifdef HAVE_DIRENT_TYPES
    if (!strcmp(dirents[0].name, "test_subdir"))
      ASSERT(dirents[0].type == UV_DIRENT_DIR);
    else
      ASSERT(dirents[0].type == UV_DIRENT_FILE);
#else
    ASSERT(dirents[0].type == UV_DIRENT_UNKNOWN);
#endif /* HAVE_DIRENT_TYPES */

    ++non_empty_readdir_cb_count;
    uv_fs_req_cleanup(req);
    dir->dirents = dirents;
    dir->nentries = ARRAY_SIZE(dirents);
    uv_fs_readdir(uv_default_loop(),
                  &readdir_req,
                  dir,
                  non_empty_readdir_cb);
  }
}